

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

int AddToPartition(ON_Mesh *mesh,ON_SimpleArray<int> *pmark,int vi,int partition_mark,int fi0)

{
  ON_SurfaceCurvature *pOVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ON_3fPoint *pOVar5;
  ON_3fVector *pOVar6;
  ON_MeshFace *pOVar7;
  ulong uVar8;
  long lVar9;
  int partition_mark_local;
  long local_80;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_74;
  ON_2fPoint t;
  ON_3fPoint v;
  ON_3fVector n;
  ON_SurfaceCurvature k;
  
  piVar4 = pmark->m_a;
  lVar9 = (long)vi;
  iVar2 = piVar4[lVar9];
  if (iVar2 == 0) {
    piVar4[lVar9] = partition_mark;
  }
  else {
    if (iVar2 == partition_mark) {
      return 0;
    }
    if (iVar2 == partition_mark + -1) {
      return 0;
    }
    if (iVar2 == partition_mark + -2) {
      piVar4[lVar9] = partition_mark + -1;
    }
    else {
      iVar2 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
      pOVar5 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
      local_80 = lVar9 * 0xc;
      v.z = pOVar5[lVar9].z;
      pOVar5 = pOVar5 + lVar9;
      v.x = pOVar5->x;
      v.y = pOVar5->y;
      partition_mark_local = partition_mark;
      ON_SimpleArray<ON_3fPoint>::Append(&(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>,&v);
      if ((mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_count == iVar2) {
        pOVar6 = (mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
        n.z = *(float *)((long)&pOVar6->z + local_80);
        n._0_8_ = *(undefined8 *)((long)&pOVar6->x + local_80);
        ON_SimpleArray<ON_3fVector>::Append(&(mesh->m_N).super_ON_SimpleArray<ON_3fVector>,&n);
      }
      if ((mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count == iVar2) {
        t = (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a[lVar9];
        ON_SimpleArray<ON_2fPoint>::Append(&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>,&t);
      }
      if ((mesh->m_K).m_count == iVar2) {
        pOVar1 = (mesh->m_K).m_a + lVar9;
        k.k1 = pOVar1->k1;
        k.k2 = pOVar1->k2;
        ON_SimpleArray<ON_SurfaceCurvature>::Append(&mesh->m_K,&k);
      }
      if ((mesh->m_C).m_count == iVar2) {
        local_74 = (mesh->m_C).m_a[lVar9].field_0;
        ON_SimpleArray<ON_Color>::Append(&mesh->m_C,(ON_Color *)&local_74);
      }
      iVar3 = (mesh->m_F).m_count;
      lVar9 = (long)fi0;
      uVar8 = lVar9 << 4 | 0xc;
      for (; lVar9 < iVar3; lVar9 = lVar9 + 1) {
        pOVar7 = (mesh->m_F).m_a;
        if (*(int *)((long)pOVar7->vi + (uVar8 - 0xc)) == vi) {
          *(int *)((long)pOVar7->vi + (uVar8 - 0xc)) = iVar2;
        }
        if (*(int *)((long)pOVar7->vi + (uVar8 - 8)) == vi) {
          *(int *)((long)pOVar7->vi + (uVar8 - 8)) = iVar2;
        }
        if (*(int *)((long)pOVar7->vi + (uVar8 - 4)) == vi) {
          *(int *)((long)pOVar7->vi + (uVar8 - 4)) = iVar2;
        }
        if (*(int *)((long)pOVar7->vi + uVar8) == vi) {
          *(int *)((long)pOVar7->vi + uVar8) = iVar2;
        }
        uVar8 = uVar8 + 0x10;
      }
      ON_SimpleArray<int>::Append(pmark,&partition_mark_local);
    }
  }
  return 1;
}

Assistant:

static int AddToPartition( ON_Mesh* mesh, ON_SimpleArray<int>& pmark, int vi, int partition_mark, int fi0 )
{
  bool b = true;
  int i, fi, new_vi, face_count, *fvi;
  i = pmark[vi];
  if ( !i ) {
    pmark[vi] = partition_mark;
  }
  else if ( i != partition_mark && i != partition_mark-1 ) {
    if ( i == partition_mark-2 )
      pmark[vi] = partition_mark-1; // vertex vi shared between two partitions
    else {
      new_vi = DupVertex(mesh,vi);
      face_count = mesh->m_F.Count();
      for ( fi = fi0; fi < face_count; fi++ ) {
        fvi = mesh->m_F[fi].vi;
        if ( fvi[0] == vi )
          fvi[0] = new_vi;
        if ( fvi[1] == vi )
          fvi[1] = new_vi;
        if ( fvi[2] == vi )
          fvi[2] = new_vi;
        if ( fvi[3] == vi )
          fvi[3] = new_vi;
      }
      pmark.Append(partition_mark);
    }
  }
  else
    b = false; // vertex already in this partition
  return b;
}